

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcLightSource::~IfcLightSource(IfcLightSource *this)

{
  _func_int *p_Var1;
  
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                   _vptr_ObjectHelper +
           (long)(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper[-3]);
  *(undefined8 *)p_Var1 = 0x8b1e18;
  *(undefined8 *)(p_Var1 + 0x80) = 0x8b1e90;
  *(undefined8 *)(p_Var1 + 0x10) = 0x8b1e40;
  *(undefined8 *)(p_Var1 + 0x20) = 0x8b1e68;
  if (*(code **)(p_Var1 + 0x30) == p_Var1 + 0x40) {
    return;
  }
  operator_delete(*(code **)(p_Var1 + 0x30));
  return;
}

Assistant:

IfcLightSource() : Object("IfcLightSource") {}